

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaceOperations.cpp
# Opt level: O0

string * gmlc::networking::getLocalExternalAddressV6(string *server)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  last2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  last2_00;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  last1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  last1_00;
  undefined1 uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  basic_resolver_entry<asio::ip::tcp> *this;
  string *in_RDI;
  int mcnt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ndef;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  int cnt;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  candidate_addresses;
  endpoint ept;
  iterator it;
  query query;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  resolved_addresses;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  interface_addresses;
  string sstring;
  iterator end;
  endpoint servep;
  iterator it_server;
  query query_server;
  resolver resolver;
  shared_ptr<gmlc::networking::AsioContextManager> srv;
  string *def;
  basic_resolver_entry<asio::ip::tcp> *in_stack_fffffffffffffb38;
  basic_resolver_query<asio::ip::tcp> *in_stack_fffffffffffffb40;
  undefined4 in_stack_fffffffffffffb48;
  int in_stack_fffffffffffffb4c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb50;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first2;
  undefined4 in_stack_fffffffffffffb58;
  undefined4 in_stack_fffffffffffffb5c;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffb60;
  protocol_type *in_stack_fffffffffffffb68;
  undefined7 in_stack_fffffffffffffb70;
  undefined1 in_stack_fffffffffffffb77;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  query *in_stack_fffffffffffffb80;
  undefined7 in_stack_fffffffffffffb88;
  undefined1 in_stack_fffffffffffffb8f;
  string *in_stack_fffffffffffffbc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3f0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3e8;
  _Alloc_hider local_3e0;
  char *local_3d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d0;
  _Alloc_hider in_stack_fffffffffffffc40;
  undefined4 in_stack_fffffffffffffc48;
  undefined4 in_stack_fffffffffffffc4c;
  int iVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_380;
  string local_364 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d1 [2];
  int local_28c;
  undefined1 local_1e4 [171];
  allocator<char> local_139 [37];
  int local_114;
  
  std::__cxx11::string::string(in_stack_fffffffffffffb50);
  AsioContextManager::getContextPointer(in_stack_fffffffffffffbc8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb40);
  std::
  __shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x7353cd);
  AsioContextManager::getBaseContext((AsioContextManager *)0x7353d5);
  asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>::basic_resolver<asio::io_context>
            ((basic_resolver<asio::ip::tcp,_asio::any_io_executor> *)
             in_stack_fffffffffffffb60._M_current,
             (io_context *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
             (constraint_t<is_convertible<io_context_&,_execution_context_&>::value>)
             ((ulong)in_stack_fffffffffffffb50 >> 0x20));
  local_114 = (int)asio::ip::tcp::v6();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb80,(char *)in_stack_fffffffffffffb78,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70));
  asio::ip::basic_resolver_query<asio::ip::tcp>::basic_resolver_query
            ((basic_resolver_query<asio::ip::tcp> *)
             CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),in_stack_fffffffffffffb68
             ,(string *)in_stack_fffffffffffffb60._M_current,
             (string *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
             (flags)((ulong)in_stack_fffffffffffffb50 >> 0x20));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb40);
  std::allocator<char>::~allocator(local_139);
  asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>::resolve
            ((basic_resolver<asio::ip::tcp,_asio::any_io_executor> *)
             CONCAT17(in_stack_fffffffffffffb8f,in_stack_fffffffffffffb88),in_stack_fffffffffffffb80
            );
  asio::ip::basic_resolver_iterator<asio::ip::tcp>::basic_resolver_iterator
            ((basic_resolver_iterator<asio::ip::tcp> *)in_stack_fffffffffffffb40,
             (basic_resolver_iterator<asio::ip::tcp> *)in_stack_fffffffffffffb38);
  asio::ip::basic_resolver_results<asio::ip::tcp>::~basic_resolver_results
            ((basic_resolver_results<asio::ip::tcp> *)0x7354bf);
  this = asio::ip::basic_resolver_iterator<asio::ip::tcp>::operator*
                   ((basic_resolver_iterator<asio::ip::tcp> *)0x7354cc);
  asio::ip::basic_resolver_entry::operator_cast_to_basic_endpoint(in_stack_fffffffffffffb38);
  asio::ip::basic_resolver_iterator<asio::ip::tcp>::basic_resolver_iterator
            ((basic_resolver_iterator<asio::ip::tcp> *)in_stack_fffffffffffffb40);
  uVar1 = asio::ip::operator==
                    ((basic_resolver_iterator<asio::ip::tcp> *)in_stack_fffffffffffffb40,
                     (basic_resolver_iterator<asio::ip::tcp> *)in_stack_fffffffffffffb38);
  if ((bool)uVar1) {
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  }
  else {
    in_stack_fffffffffffffb80 = (query *)local_1e4;
    asio::ip::basic_endpoint<asio::ip::tcp>::address(&in_stack_fffffffffffffb38->endpoint_);
    asio::ip::address::to_string_abi_cxx11_
              ((address *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  }
  netif::getInterfaceAddressesV6_abi_cxx11_();
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x735580);
  local_28c = (int)asio::ip::tcp::v6();
  asio::ip::host_name_abi_cxx11_();
  __str = local_2d1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb80,(char *)__str,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70));
  asio::ip::basic_resolver_query<asio::ip::tcp>::basic_resolver_query
            ((basic_resolver_query<asio::ip::tcp> *)
             CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),in_stack_fffffffffffffb68
             ,(string *)in_stack_fffffffffffffb60._M_current,
             (string *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
             (flags)((ulong)in_stack_fffffffffffffb50 >> 0x20));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb40);
  std::allocator<char>::~allocator((allocator<char> *)local_2d1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb40);
  asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>::resolve
            ((basic_resolver<asio::ip::tcp,_asio::any_io_executor> *)
             CONCAT17(uVar1,in_stack_fffffffffffffb88),in_stack_fffffffffffffb80);
  asio::ip::basic_resolver_iterator<asio::ip::tcp>::basic_resolver_iterator
            ((basic_resolver_iterator<asio::ip::tcp> *)in_stack_fffffffffffffb40,
             (basic_resolver_iterator<asio::ip::tcp> *)in_stack_fffffffffffffb38);
  asio::ip::basic_resolver_results<asio::ip::tcp>::~basic_resolver_results
            ((basic_resolver_results<asio::ip::tcp> *)0x73565f);
  while (bVar2 = asio::ip::operator!=
                           ((basic_resolver_iterator<asio::ip::tcp> *)in_stack_fffffffffffffb40,
                            (basic_resolver_iterator<asio::ip::tcp> *)in_stack_fffffffffffffb38),
        bVar2) {
    asio::ip::basic_resolver_iterator<asio::ip::tcp>::operator*
              ((basic_resolver_iterator<asio::ip::tcp> *)0x735694);
    asio::ip::basic_resolver_entry::operator_cast_to_basic_endpoint(in_stack_fffffffffffffb38);
    in_stack_fffffffffffffb60._M_current = (char *)local_364;
    asio::ip::basic_endpoint<asio::ip::tcp>::address(&in_stack_fffffffffffffb38->endpoint_);
    asio::ip::address::to_string_abi_cxx11_
              ((address *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffb40,(value_type *)in_stack_fffffffffffffb38);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb40);
    asio::ip::basic_resolver_iterator<asio::ip::tcp>::operator++
              ((basic_resolver_iterator<asio::ip::tcp> *)in_stack_fffffffffffffb40);
  }
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT17(uVar1,in_stack_fffffffffffffb88));
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT17(uVar1,in_stack_fffffffffffffb88));
  prioritizeExternalAddresses
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffc40._M_p);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffb50);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffb50);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](&local_380,0);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb80,__str);
  first2._M_current = local_1e4 + 0x1c;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb38);
  local_3d0._8_8_ =
       CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  local_3d0._M_allocated_capacity =
       (size_type)
       CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  in_stack_fffffffffffffb38);
  local_3d8 = (char *)CLI::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  last1._M_current._4_4_ = in_stack_fffffffffffffb5c;
  last1._M_current._0_4_ = in_stack_fffffffffffffb58;
  last2._M_current._4_4_ = in_stack_fffffffffffffb4c;
  last2._M_current._0_4_ = in_stack_fffffffffffffb48;
  iVar3 = matchcount<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                    (in_stack_fffffffffffffb60,last1,first2,last2);
  local_3e0._M_p = (pointer)&local_380;
  iVar5 = iVar3;
  local_3e8._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       CLI::std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffb38);
  local_3f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              CLI::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffb38);
  while (bVar2 = __gnu_cxx::
                 operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffb40,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffb38), ((bVar2 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator*(&local_3e8);
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb80,__str);
    in_stack_fffffffffffffb38 = (basic_resolver_entry<asio::ip::tcp> *)(local_1e4 + 0x1c);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb38);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
    in_stack_fffffffffffffb40 = (basic_resolver_query<asio::ip::tcp> *)&stack0xfffffffffffffbf0;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb38);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
    last1_00._M_current._4_4_ = iVar3;
    last1_00._M_current._0_4_ = in_stack_fffffffffffffb58;
    last2_00._M_current._4_4_ = in_stack_fffffffffffffb4c;
    last2_00._M_current._0_4_ = in_stack_fffffffffffffb48;
    iVar4 = matchcount<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                      (in_stack_fffffffffffffb60,last1_00,first2,last2_00);
    in_stack_fffffffffffffb4c = iVar4;
    if ((iVar5 < iVar4) && (6 < iVar4)) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                in_stack_fffffffffffffb40,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                in_stack_fffffffffffffb38);
      iVar5 = iVar4;
    }
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb40);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_3e8);
  }
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)first2._M_current);
  asio::ip::basic_resolver_iterator<asio::ip::tcp>::~basic_resolver_iterator
            ((basic_resolver_iterator<asio::ip::tcp> *)0x735c78);
  asio::ip::basic_resolver_query<asio::ip::tcp>::~basic_resolver_query(in_stack_fffffffffffffb40);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)first2._M_current);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)first2._M_current);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb40);
  asio::ip::basic_resolver_iterator<asio::ip::tcp>::~basic_resolver_iterator
            ((basic_resolver_iterator<asio::ip::tcp> *)0x735cb9);
  asio::ip::basic_resolver_iterator<asio::ip::tcp>::~basic_resolver_iterator
            ((basic_resolver_iterator<asio::ip::tcp> *)0x735cc6);
  asio::ip::basic_resolver_query<asio::ip::tcp>::~basic_resolver_query(in_stack_fffffffffffffb40);
  asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>::~basic_resolver
            ((basic_resolver<asio::ip::tcp,_asio::any_io_executor> *)in_stack_fffffffffffffb40);
  std::shared_ptr<gmlc::networking::AsioContextManager>::~shared_ptr
            ((shared_ptr<gmlc::networking::AsioContextManager> *)0x735ced);
  return in_RDI;
}

Assistant:

std::string getLocalExternalAddressV6(const std::string& server)
{
#ifndef GMLC_NETWORKING_DISABLE_ASIO
    auto srv = gmlc::networking::AsioContextManager::getContextPointer();

    asio::ip::tcp::resolver resolver(srv->getBaseContext());

    asio::ip::tcp::resolver::query query_server(
        asio::ip::tcp::v6(), server, "");
    asio::ip::tcp::resolver::iterator it_server =
        resolver.resolve(query_server);
    asio::ip::tcp::endpoint servep = *it_server;
    asio::ip::tcp::resolver::iterator end;

    auto sstring = (it_server == end) ? server : servep.address().to_string();
#else
    std::string sstring = server;
#endif
    auto interface_addresses = gmlc::netif::getInterfaceAddressesV6();
    std::vector<std::string> resolved_addresses;
#ifndef GMLC_NETWORKING_DISABLE_ASIO
    asio::ip::tcp::resolver::query query(
        asio::ip::tcp::v6(), asio::ip::host_name(), "");
    asio::ip::tcp::resolver::iterator it = resolver.resolve(query);
    // asio::ip::tcp::endpoint endpoint = *it;

    while (it != end) {
        asio::ip::tcp::endpoint ept = *it;
        resolved_addresses.push_back(ept.address().to_string());
        ++it;
    }
#endif
    auto candidate_addresses =
        prioritizeExternalAddresses(interface_addresses, resolved_addresses);

    int cnt = 0;
    std::string def = candidate_addresses[0];
    cnt = matchcount(sstring.begin(), sstring.end(), def.begin(), def.end());
    for (auto ndef : candidate_addresses) {
        auto mcnt = matchcount(
            sstring.begin(), sstring.end(), ndef.begin(), ndef.end());
        if ((mcnt > cnt) && (mcnt >= 7)) {
            def = ndef;
            cnt = mcnt;
        }
    }
    return def;
}